

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O2

char * afm_parser_next_key(AFM_Parser parser,FT_Bool line,FT_Offset *len)

{
  AFM_Stream stream;
  undefined8 *puVar1;
  char *pcVar2;
  FT_Byte *pFVar3;
  undefined7 in_register_00000031;
  
  puVar1 = (undefined8 *)CONCAT71(in_register_00000031,line);
  stream = parser->stream;
  if (stream->status < 2) {
    afm_stream_read_string(stream);
  }
  do {
    stream->status = 0;
    pcVar2 = afm_stream_read_one(stream);
    if (pcVar2 != (char *)0x0) {
      if (puVar1 == (undefined8 *)0x0) {
        return pcVar2;
      }
      pFVar3 = stream->cursor + ~(ulong)pcVar2;
      goto LAB_0014c379;
    }
  } while (stream->status == 2);
  pFVar3 = (FT_Byte *)0x0;
  if (puVar1 == (undefined8 *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
LAB_0014c379:
    *puVar1 = pFVar3;
  }
  return pcVar2;
}

Assistant:

FT_LOCAL_DEF( char* )
  afm_parser_next_key( AFM_Parser  parser,
                       FT_Bool     line,
                       FT_Offset*  len )
  {
    AFM_Stream  stream = parser->stream;
    char*       key    = NULL;  /* make stupid compiler happy */


    if ( line )
    {
      while ( 1 )
      {
        /* skip current line */
        if ( !AFM_STATUS_EOL( stream ) )
          afm_stream_read_string( stream );

        stream->status = AFM_STREAM_STATUS_NORMAL;
        key = afm_stream_read_one( stream );

        /* skip empty line */
        if ( !key                      &&
             !AFM_STATUS_EOF( stream ) &&
             AFM_STATUS_EOL( stream )  )
          continue;

        break;
      }
    }
    else
    {
      while ( 1 )
      {
        /* skip current column */
        while ( !AFM_STATUS_EOC( stream ) )
          afm_stream_read_one( stream );

        stream->status = AFM_STREAM_STATUS_NORMAL;
        key = afm_stream_read_one( stream );

        /* skip empty column */
        if ( !key                      &&
             !AFM_STATUS_EOF( stream ) &&
             AFM_STATUS_EOC( stream )  )
          continue;

        break;
      }
    }

    if ( len )
      *len = ( key ) ? (FT_Offset)AFM_STREAM_KEY_LEN( stream, key )
                     : 0;

    return key;
  }